

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteMessageTests::TestdontKnowTradeSetString::TestdontKnowTradeSetString
          (TestdontKnowTradeSetString *this)

{
  char *suiteName;
  TestdontKnowTradeSetString *this_local;
  
  suiteName = SuiteMessageTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"dontKnowTradeSetString",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/MessagesTestCase.cpp"
             ,0x373);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__TestdontKnowTradeSetString_00459170;
  return;
}

Assistant:

TEST(dontKnowTradeSetString)
{
  DontKnowTrade object;

  object.setString
    ( "8=FIX.4.2\0019=45\00135=Q\00117=EXECID\00137=ORDERID\001"
      "54=2\00155=MSFT\001127=1\00110=195\001" );

  OrderID orderID;
  ExecID execID;
  DKReason dKReason;
  Symbol symbol;
  Side side;
  CHECK_EQUAL( "ORDERID", object.get( orderID ) );
  CHECK_EQUAL( "EXECID", object.get( execID ) );
  CHECK_EQUAL( '1', object.get( dKReason ) );
  CHECK_EQUAL( "MSFT", object.get( symbol ) );
  CHECK_EQUAL( '2', object.get( side ) );
}